

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

int cmcmd::ExecuteLinkScript
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  cmsysProcess *cp;
  ostream *poVar7;
  char *pcVar8;
  size_t sVar9;
  string command;
  char *cmd [2];
  ifstream fin;
  string local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  undefined8 local_240;
  string local_238;
  byte abStack_218 [488];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x61) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    lVar6 = std::__cxx11::string::find((char *)(pbVar1 + 3),0x515603,0);
    if (lVar6 == 0) {
      std::__cxx11::string::substr
                ((ulong)&local_238,
                 (ulong)((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 3));
      bVar2 = cmSystemTools::IsOff(&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      bVar2 = !bVar2;
    }
  }
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error allocating process instance in link script.",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    iVar5 = 1;
  }
  else {
    cmsysProcess_SetPipeShared(cp,2,1);
    cmsysProcess_SetPipeShared(cp,3,1);
    cmsysProcess_SetOption(cp,3,1);
    std::ifstream::ifstream
              (&local_238,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,_S_in);
    if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      local_268._M_string_length = 0;
      local_268.field_2._M_local_buf[0] = '\0';
      iVar5 = 0;
      do {
        bVar3 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&local_238,&local_268,(bool *)0x0,-1);
        if (!bVar3) break;
        iVar5 = 0;
        lVar6 = std::__cxx11::string::find_first_not_of((char *)&local_268,0x51565c,0);
        if (lVar6 != -1) {
          local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_268._M_dataplus._M_p;
          local_240 = 0;
          cmsysProcess_SetCommand(cp,(char **)&local_248);
          if (bVar2) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_268._M_dataplus._M_p,
                                local_268._M_string_length);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          cmsysProcess_Execute(cp);
          cmsysProcess_WaitForExit(cp,(double *)0x0);
          iVar4 = cmsysProcess_GetState(cp);
          if (iVar4 == 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error running link command: ",0x1c);
            pcVar8 = cmsysProcess_GetErrorString(cp);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x68e3c8);
            }
            else {
              sVar9 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9)
              ;
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
            std::ostream::put(-0x38);
            iVar5 = 2;
            std::ostream::flush();
          }
          else if (iVar4 == 2) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error running link command: ",0x1c);
            pcVar8 = cmsysProcess_GetExceptionString(cp);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x68e3c8);
            }
            else {
              sVar9 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9)
              ;
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
            std::ostream::put(-0x38);
            iVar5 = 1;
            std::ostream::flush();
          }
          else {
            iVar5 = 0;
            if (iVar4 == 4) {
              iVar5 = cmsysProcess_GetExitValue(cp);
            }
          }
        }
      } while (iVar5 == 0);
      cmsysProcess_Delete(cp);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                 local_268.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error opening link script \"",0x1b);
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,pbVar1[2]._M_dataplus._M_p,
                          pbVar1[2]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      iVar5 = 1;
      std::ostream::flush();
    }
    std::ifstream::~ifstream(&local_238);
  }
  return iVar5;
}

Assistant:

int cmcmd::ExecuteLinkScript(std::vector<std::string> const& args)
{
  // The arguments are
  //   args[0] == <cmake-executable>
  //   args[1] == cmake_link_script
  //   args[2] == <link-script-name>
  //   args[3] == --verbose=?
  bool verbose = false;
  if (args.size() >= 4) {
    if (args[3].find("--verbose=") == 0) {
      if (!cmSystemTools::IsOff(args[3].substr(10))) {
        verbose = true;
      }
    }
  }

  // Allocate a process instance.
  cmsysProcess* cp = cmsysProcess_New();
  if (!cp) {
    std::cerr << "Error allocating process instance in link script."
              << std::endl;
    return 1;
  }

  // Children should share stdout and stderr with this process.
  cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
  cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);

  // Run the command lines verbatim.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_Verbatim, 1);

  // Read command lines from the script.
  cmsys::ifstream fin(args[2].c_str());
  if (!fin) {
    std::cerr << "Error opening link script \"" << args[2] << "\""
              << std::endl;
    return 1;
  }

  // Run one command at a time.
  std::string command;
  int result = 0;
  while (result == 0 && cmSystemTools::GetLineFromStream(fin, command)) {
    // Skip empty command lines.
    if (command.find_first_not_of(" \t") == std::string::npos) {
      continue;
    }

    // Setup this command line.
    const char* cmd[2] = { command.c_str(), nullptr };
    cmsysProcess_SetCommand(cp, cmd);

    // Report the command if verbose output is enabled.
    if (verbose) {
      std::cout << command << std::endl;
    }

    // Run the command and wait for it to exit.
    cmsysProcess_Execute(cp);
    cmsysProcess_WaitForExit(cp, nullptr);

    // Report failure if any.
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        int value = cmsysProcess_GetExitValue(cp);
        if (value != 0) {
          result = value;
        }
      } break;
      case cmsysProcess_State_Exception:
        std::cerr << "Error running link command: "
                  << cmsysProcess_GetExceptionString(cp) << std::endl;
        result = 1;
        break;
      case cmsysProcess_State_Error:
        std::cerr << "Error running link command: "
                  << cmsysProcess_GetErrorString(cp) << std::endl;
        result = 2;
        break;
      default:
        break;
    }
  }

  // Free the process instance.
  cmsysProcess_Delete(cp);

  // Return the final resulting return value.
  return result;
}